

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_noise_estimate.c
# Opt level: O1

void av1_noise_estimate_init(NOISE_ESTIMATE *ne,int width,int height)

{
  long lVar1;
  int iVar2;
  
  lVar1 = (long)height * (long)width;
  ne->enabled = 0;
  iVar2 = 0x8c;
  if (0x1fa3ff < lVar1) {
    iVar2 = 200;
  }
  ne->level = (uint)(0xe0fff < lVar1);
  ne->value = 0;
  ne->thresh = 0x5a;
  ne->count = 0;
  ne->last_w = 0;
  ne->last_h = 0;
  if ((0xe0fff < lVar1) || (iVar2 = 0x73, 0x383ff < lVar1)) {
    ne->thresh = iVar2;
  }
  ne->num_frames_estimate = 0xf;
  ne->adapt_thresh = (ne->thresh >> 1) + ne->thresh;
  return;
}

Assistant:

void av1_noise_estimate_init(NOISE_ESTIMATE *const ne, int width, int height) {
  const int64_t area = (int64_t)width * height;
  ne->enabled = 0;
  ne->level = (area < 1280 * 720) ? kLowLow : kLow;
  ne->value = 0;
  ne->count = 0;
  ne->thresh = 90;
  ne->last_w = 0;
  ne->last_h = 0;
  if (area >= 1920 * 1080) {
    ne->thresh = 200;
  } else if (area >= 1280 * 720) {
    ne->thresh = 140;
  } else if (area >= 640 * 360) {
    ne->thresh = 115;
  }
  ne->num_frames_estimate = 15;
  ne->adapt_thresh = (3 * ne->thresh) >> 1;
}